

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O3

uint lodepng::getFilterTypesInterlaced
               (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                *filterTypes,vector<unsigned_char,_std::allocator<unsigned_char>_> *png)

{
  pointer *ppuVar1;
  pointer puVar2;
  iterator iVar3;
  vector<unsigned_char,std::allocator<unsigned_char>> *pvVar4;
  uint uVar5;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *pvVar6;
  uint uVar7;
  int iVar8;
  uint w_00;
  size_t sVar9;
  uchar *puVar10;
  size_t sVar11;
  uint uVar12;
  size_t j;
  long lVar13;
  ulong uVar14;
  uchar *puVar15;
  long lVar16;
  uint w;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  char type [5];
  vector<unsigned_char,_std::allocator<unsigned_char>_> zdata;
  uint h;
  State state;
  uint local_2ac;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_2a8;
  char local_27d [5];
  uchar *local_278;
  iterator iStack_270;
  uchar *local_268;
  uint local_254;
  uchar *local_250;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *local_248;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_240;
  uchar *local_238;
  LodePNGState local_230;
  
  State::State((State *)&local_230);
  puVar15 = (png->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_start;
  uVar7 = lodepng_inspect(&local_2ac,&local_254,&local_230,puVar15,
                          (long)(png->
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                                _M_impl.super__Vector_impl_data._M_finish - (long)puVar15);
  uVar12 = 1;
  if (uVar7 == 0) {
    puVar2 = (png->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    local_250 = (png->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    local_278 = (uchar *)0x0;
    iStack_270._M_current = (uchar *)0x0;
    local_268 = (uchar *)0x0;
    local_248 = filterTypes;
    local_240 = png;
    if (puVar2 + 0x10 < local_250) {
      local_238 = puVar2 + 8;
      ppuVar1 = &local_2a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage;
      puVar15 = local_238;
      while( true ) {
        lodepng_chunk_type(local_27d,puVar15);
        local_2a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)ppuVar1;
        sVar9 = strlen(local_27d);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2a8,local_27d,local_27d + sVar9);
        puVar2 = local_2a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_finish;
        if ((pointer *)
            local_2a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != ppuVar1) {
          operator_delete(local_2a8.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (ulong)(local_2a8.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
        }
        filterTypes = local_248;
        if (puVar2 != (pointer)0x4) break;
        local_2a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)ppuVar1;
        sVar9 = strlen(local_27d);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2a8,local_27d,local_27d + sVar9);
        iVar8 = std::__cxx11::string::compare((char *)&local_2a8);
        if ((pointer *)
            local_2a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != ppuVar1) {
          operator_delete(local_2a8.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (ulong)(local_2a8.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
        }
        if (iVar8 == 0) {
          puVar10 = lodepng_chunk_data_const(puVar15);
          uVar7 = lodepng_chunk_length(puVar15);
          uVar14 = (ulong)uVar7;
          if ((local_250 < puVar15 + uVar14 + 0xc) ||
             ((ulong)((long)(local_240->
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)(local_240->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_start) < uVar14)) {
            uVar12 = 1;
            goto LAB_0011b7ec;
          }
          if (uVar7 != 0) {
            do {
              if (iStack_270._M_current == local_268) {
                std::vector<unsigned_char,std::allocator<unsigned_char>>::
                _M_realloc_insert<unsigned_char_const&>
                          ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_278,
                           iStack_270,puVar10);
              }
              else {
                *iStack_270._M_current = *puVar10;
                iStack_270._M_current = iStack_270._M_current + 1;
              }
              puVar10 = puVar10 + 1;
              uVar14 = uVar14 - 1;
            } while (uVar14 != 0);
          }
        }
        puVar10 = lodepng_chunk_next_const(puVar15);
        if (((puVar10 <= puVar15) || (local_250 <= puVar10 + 8)) ||
           (puVar15 = puVar10, puVar10 < local_238)) break;
      }
    }
    local_2a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_2a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar7 = decompress(&local_2a8,local_278,(long)iStack_270._M_current - (long)local_278,
                       &lodepng_default_decompress_settings);
    uVar12 = 1;
    if (uVar7 == 0) {
      if (local_230.info_png.interlace_method == 0) {
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::resize(filterTypes,1);
        sVar11 = lodepng_get_raw_size(local_2ac,1,&local_230.info_png.color);
        if (local_2a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_2a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start) {
          uVar14 = 0;
          do {
            pvVar4 = (vector<unsigned_char,std::allocator<unsigned_char>> *)
                     (filterTypes->
                     super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            iVar3._M_current = *(uchar **)(pvVar4 + 8);
            if (iVar3._M_current == *(uchar **)(pvVar4 + 0x10)) {
              std::vector<unsigned_char,std::allocator<unsigned_char>>::
              _M_realloc_insert<unsigned_char_const&>
                        (pvVar4,iVar3,
                         (uchar *)((long)local_2a8.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start + uVar14));
            }
            else {
              *iVar3._M_current =
                   *(uchar *)((long)local_2a8.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start + uVar14);
              *(long *)(pvVar4 + 8) = *(long *)(pvVar4 + 8) + 1;
            }
            uVar14 = uVar14 + sVar11 + 1;
          } while (uVar14 < (ulong)((long)local_2a8.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_2a8.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start));
        }
        uVar12 = 0;
      }
      else {
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::resize(filterTypes,7);
        lVar13 = 0;
        lVar16 = 0;
        do {
          uVar5 = local_254;
          uVar7 = getFilterTypesInterlaced::ADAM7_IY[lVar13];
          uVar12 = getFilterTypesInterlaced::ADAM7_DY[lVar13];
          w_00 = (~getFilterTypesInterlaced::ADAM7_IX[lVar13] + local_2ac +
                 getFilterTypesInterlaced::ADAM7_DX[lVar13]) /
                 getFilterTypesInterlaced::ADAM7_DX[lVar13];
          if (local_2ac <= getFilterTypesInterlaced::ADAM7_IX[lVar13]) {
            w_00 = 0;
          }
          sVar11 = lodepng_get_raw_size(w_00,1,&local_230.info_png.color);
          pvVar6 = local_248;
          uVar14 = (ulong)(~uVar7 + uVar5 + uVar12) / (ulong)uVar12;
          if (uVar5 <= uVar7) {
            uVar14 = 0;
          }
          if ((int)uVar14 != 0) {
            do {
              pvVar4 = (vector<unsigned_char,std::allocator<unsigned_char>> *)
                       ((pvVar6->
                        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + lVar13);
              iVar3._M_current = *(uchar **)(pvVar4 + 8);
              if (iVar3._M_current == *(uchar **)(pvVar4 + 0x10)) {
                std::vector<unsigned_char,std::allocator<unsigned_char>>::
                _M_realloc_insert<unsigned_char_const&>
                          (pvVar4,iVar3,
                           (uchar *)((long)local_2a8.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start + lVar16));
              }
              else {
                *iVar3._M_current =
                     *(uchar *)((long)local_2a8.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar16);
                *(long *)(pvVar4 + 8) = *(long *)(pvVar4 + 8) + 1;
              }
              lVar16 = lVar16 + sVar11 + 1;
              uVar14 = uVar14 - 1;
            } while (uVar14 != 0);
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 != 7);
        uVar12 = 0;
      }
    }
    if ((pointer *)
        local_2a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer *)0x0) {
      operator_delete(local_2a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_2a8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_2a8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
LAB_0011b7ec:
    if (local_278 != (uchar *)0x0) {
      operator_delete(local_278,(long)local_268 - (long)local_278);
    }
  }
  State::~State((State *)&local_230);
  return uVar12;
}

Assistant:

unsigned getFilterTypesInterlaced(std::vector<std::vector<unsigned char> >& filterTypes,
                                  const std::vector<unsigned char>& png) {
  //Get color type and interlace type
  lodepng::State state;
  unsigned w, h;
  unsigned error;
  error = lodepng_inspect(&w, &h, &state, &png[0], png.size());

  if(error) return 1;

  //Read literal data from all IDAT chunks
  const unsigned char *chunk, *begin, *end, *next;
  end = &png.back() + 1;
  begin = chunk = &png.front() + 8;

  std::vector<unsigned char> zdata;

  while(chunk + 8 < end && chunk >= begin) {
    char type[5];
    lodepng_chunk_type(type, chunk);
    if(std::string(type).size() != 4) break; //Probably not a PNG file

    if(std::string(type) == "IDAT") {
      const unsigned char* cdata = lodepng_chunk_data_const(chunk);
      unsigned clength = lodepng_chunk_length(chunk);
      if(chunk + clength + 12 > end || clength > png.size() || chunk + clength + 12 < begin) {
        // corrupt chunk length
        return 1;
      }

      for(unsigned i = 0; i < clength; i++) {
        zdata.push_back(cdata[i]);
      }
    }

    next = lodepng_chunk_next_const(chunk);
    if (next <= chunk) break; // integer overflow
    chunk = next;
  }

  //Decompress all IDAT data (if the while loop ended early, this might fail)
  std::vector<unsigned char> data;
  error = lodepng::decompress(data, &zdata[0], zdata.size());

  if(error) return 1;

  if(state.info_png.interlace_method == 0) {
    filterTypes.resize(1);

    //A line is 1 filter byte + all pixels
    size_t linebytes = 1 + lodepng_get_raw_size(w, 1, &state.info_png.color);

    for(size_t i = 0; i < data.size(); i += linebytes) {
      filterTypes[0].push_back(data[i]);
    }
  } else {
    //Interlaced
    filterTypes.resize(7);
    static const unsigned ADAM7_IX[7] = { 0, 4, 0, 2, 0, 1, 0 }; /*x start values*/
    static const unsigned ADAM7_IY[7] = { 0, 0, 4, 0, 2, 0, 1 }; /*y start values*/
    static const unsigned ADAM7_DX[7] = { 8, 8, 4, 4, 2, 2, 1 }; /*x delta values*/
    static const unsigned ADAM7_DY[7] = { 8, 8, 8, 4, 4, 2, 2 }; /*y delta values*/
    size_t pos = 0;
    for(size_t j = 0; j < 7; j++) {
      unsigned w2 = (w - ADAM7_IX[j] + ADAM7_DX[j] - 1) / ADAM7_DX[j];
      unsigned h2 = (h - ADAM7_IY[j] + ADAM7_DY[j] - 1) / ADAM7_DY[j];
      if(ADAM7_IX[j] >= w) w2 = 0;
      if(ADAM7_IY[j] >= h) h2 = 0;
      size_t linebytes = 1 + lodepng_get_raw_size(w2, 1, &state.info_png.color);
      for(size_t i = 0; i < h2; i++) {
        filterTypes[j].push_back(data[pos]);
        pos += linebytes;
      }
    }
  }
  return 0; /* OK */
}